

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O1

float __thiscall DBSCAN::GetDistance(DBSCAN *this,Embedding *emb1,Embedding *emb2)

{
  float *__first;
  float *__first_00;
  int *__last;
  long lVar1;
  int *__last_00;
  float fVar2;
  double dVar3;
  float fVar4;
  float fVar5;
  vector<float,_std::allocator<float>_> tmp;
  vector<float,_std::allocator<float>_> tmp_1;
  allocator_type local_89;
  float local_88;
  float local_84;
  double local_80;
  double local_78;
  void *local_70 [2];
  long local_60;
  float local_54;
  float local_50;
  float local_4c;
  void *local_48 [2];
  long local_38;
  
  __first = emb1->emb;
  __last_00 = &emb1->cluster_id;
  __first_00 = emb2->emb;
  __last = &emb2->cluster_id;
  fVar2 = 0.0;
  lVar1 = 0;
  fVar4 = 0.0;
  fVar5 = 0.0;
  do {
    local_88 = fVar5;
    local_84 = fVar4;
    local_4c = fVar2;
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_70,__first,(float *)__last_00,
               (allocator_type *)local_48);
    local_78._0_4_ = *(float *)((long)local_70[0] + lVar1 * 4);
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_48,__first_00,(float *)__last,&local_89)
    ;
    local_78 = (double)CONCAT44(local_78._4_4_,
                                local_78._0_4_ * *(float *)((long)local_48[0] + lVar1 * 4));
    if (local_48[0] != (void *)0x0) {
      operator_delete(local_48[0],local_38 - (long)local_48[0]);
    }
    if (local_70[0] != (void *)0x0) {
      operator_delete(local_70[0],local_60 - (long)local_70[0]);
    }
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_70,__first,(float *)__last_00,
               (allocator_type *)local_48);
    local_50 = *(float *)((long)local_70[0] + lVar1 * 4);
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_48,__first,(float *)__last_00,&local_89)
    ;
    local_54 = *(float *)((long)local_48[0] + lVar1 * 4);
    if (local_48[0] != (void *)0x0) {
      operator_delete(local_48[0],local_38 - (long)local_48[0]);
    }
    if (local_70[0] != (void *)0x0) {
      operator_delete(local_70[0],local_60 - (long)local_70[0]);
    }
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_70,__first_00,(float *)__last,
               (allocator_type *)local_48);
    local_80._0_4_ = *(float *)((long)local_70[0] + lVar1 * 4);
    std::vector<float,std::allocator<float>>::vector<float*,void>
              ((vector<float,std::allocator<float>> *)local_48,__first_00,(float *)__last,&local_89)
    ;
    fVar5 = local_80._0_4_ * *(float *)((long)local_48[0] + lVar1 * 4);
    local_80 = (double)CONCAT44(local_80._4_4_,fVar5);
    if (local_48[0] != (void *)0x0) {
      operator_delete(local_48[0],local_38 - (long)local_48[0]);
      fVar5 = local_80._0_4_;
    }
    if (local_70[0] != (void *)0x0) {
      operator_delete(local_70[0],local_60 - (long)local_70[0]);
      fVar5 = local_80._0_4_;
    }
    fVar4 = local_84 + local_78._0_4_;
    fVar2 = local_4c + local_50 * local_54;
    fVar5 = local_88 + fVar5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x200);
  dVar3 = (double)fVar2;
  if (dVar3 < 0.0) {
    local_88 = fVar5;
    local_84 = fVar4;
    local_80 = sqrt(dVar3);
    fVar5 = local_88;
    fVar4 = local_84;
  }
  else {
    local_80 = SQRT(dVar3);
  }
  local_78 = (double)fVar4;
  dVar3 = (double)fVar5;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  return (float)(local_78 / (local_80 * dVar3));
}

Assistant:

float DBSCAN::GetDistance(Embedding emb1, Embedding emb2)
{
    float f1dis = 0;
    float f2dis = 0;
    float f1f2dis = 0;
    for (size_t i = 0; i < EMB_SIZE; i++)
    {
        f1f2dis += (float)emb1.GetEmb()[i] * (float)emb2.GetEmb()[i];
        f1dis += (float)emb1.GetEmb()[i] * (float)emb1.GetEmb()[i];
        f2dis += (float)emb2.GetEmb()[i] * (float)emb2.GetEmb()[i];
    }

    float distance = f1f2dis / (sqrt(f1dis) * sqrt(f2dis));
    return distance;        //开方并返回距离
}